

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

void __thiscall SQTable::Mark(SQTable *this,SQCollectable **chain)

{
  ulong uVar1;
  SQTable *pSVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  uVar1 = (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  if (-1 < (int)uVar1) {
    (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef = uVar1 | 0x80000000;
    pSVar2 = (this->super_SQDelegable)._delegate;
    if (pSVar2 != (SQTable *)0x0) {
      (*(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[4])
                (pSVar2,chain);
    }
    lVar4 = 0;
    if (0 < this->_numofnodes) {
      lVar4 = this->_numofnodes;
    }
    lVar3 = 0x10;
    while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
      SQSharedState::MarkObject
                ((SQObjectPtr *)((long)&(this->_nodes->val).super_SQObject._type + lVar3),
                 (SQCollectable_conflict **)chain);
      SQSharedState::MarkObject
                ((SQObjectPtr *)((long)this->_nodes + lVar3 + -0x10),
                 (SQCollectable_conflict **)chain);
      lVar3 = lVar3 + 0x28;
    }
    SQCollectable::RemoveFromChain
              (&((this->super_SQDelegable).super_SQCollectable._sharedstate)->_gc_chain,
               (SQCollectable_conflict *)this);
    SQCollectable::AddToChain((SQCollectable_conflict **)chain,(SQCollectable_conflict *)this);
    return;
  }
  return;
}

Assistant:

void SQTable::Mark(SQCollectable **chain)
{
    START_MARK()
        if(_delegate) _delegate->Mark(chain);
        SQInteger len = _numofnodes;
        for(SQInteger i = 0; i < len; i++){
            SQSharedState::MarkObject(_nodes[i].key, chain);
            SQSharedState::MarkObject(_nodes[i].val, chain);
        }
    END_MARK()
}